

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void write_config_options(FILE_conflict *fp,nh_option_desc *options)

{
  nh_option_desc *pnVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  pcVar3 = options->name;
  while (pcVar3 != (char *)0x0) {
    uVar2 = nh_get_option_string(options);
    pcVar3 = "%s=%s\n";
    if ((options->type & ~OPTTYPE_INT) == OPTTYPE_ENUM) {
      pcVar3 = "%s=\"%s\"\n";
    }
    fprintf((FILE *)fp,pcVar3,options->name,uVar2);
    pnVar1 = options + 1;
    options = options + 1;
    pcVar3 = pnVar1->name;
  }
  return;
}

Assistant:

static void write_config_options(FILE *fp, struct nh_option_desc *options)
{
    int i;
    const char *optval;
    
    for (i = 0; options[i].name; i++) {
	optval = nh_get_option_string(&options[i]);
	if (options[i].type == OPTTYPE_STRING ||
	    options[i].type == OPTTYPE_ENUM)
	    fprintf(fp, "%s=\"%s\"\n", options[i].name, optval);
	else
	    fprintf(fp, "%s=%s\n", options[i].name, optval);
    }
}